

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O2

void __thiscall
pbrt::SingleLevelFlattener::SingleLevelFlattener(SingleLevelFlattener *this,SP *world)

{
  _Rb_tree_header *p_Var1;
  element_type *peVar2;
  __shared_ptr<pbrt::LightSource,_(__gnu_cxx::_Lock_policy)2> *p_Var3;
  __shared_ptr<pbrt::LightSource,_(__gnu_cxx::_Lock_policy)2> *p_Var4;
  shared_ptr<pbrt::LightSource> lightSource;
  __shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2> _Stack_78;
  undefined1 local_68 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_60;
  undefined8 local_58;
  undefined1 auStack_50 [16];
  undefined8 uStack_40;
  
  std::make_shared<pbrt::Object>();
  (this->alreadyEmitted)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->alreadyEmitted)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->alreadyEmitted)._M_t._M_impl.super__Rb_tree_header;
  (this->alreadyEmitted)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->alreadyEmitted)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->alreadyEmitted)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  peVar2 = (world->super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var3 = &((peVar2->lightSources).
             super__Vector_base<std::shared_ptr<pbrt::LightSource>,_std::allocator<std::shared_ptr<pbrt::LightSource>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->
            super___shared_ptr<pbrt::LightSource,_(__gnu_cxx::_Lock_policy)2>;
  for (p_Var4 = &((peVar2->lightSources).
                  super__Vector_base<std::shared_ptr<pbrt::LightSource>,_std::allocator<std::shared_ptr<pbrt::LightSource>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->
                 super___shared_ptr<pbrt::LightSource,_(__gnu_cxx::_Lock_policy)2>; p_Var4 != p_Var3
      ; p_Var4 = p_Var4 + 1) {
    std::__shared_ptr<pbrt::LightSource,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<pbrt::LightSource,_(__gnu_cxx::_Lock_policy)2> *)local_68,p_Var4);
    std::
    vector<std::shared_ptr<pbrt::LightSource>,_std::allocator<std::shared_ptr<pbrt::LightSource>_>_>
    ::push_back(&((this->result).super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                 )->lightSources,(value_type *)local_68);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_60);
  }
  std::__shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&_Stack_78,&world->super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>);
  local_68 = (undefined1  [8])0x3f800000;
  _Stack_60._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_58._0_4_ = 1.0;
  local_58._4_4_ = 0.0;
  auStack_50._0_4_ = 0.0;
  auStack_50._4_4_ = 0.0;
  auStack_50._8_4_ = 1.0;
  auStack_50._12_4_ = 0.0;
  uStack_40._0_4_ = 0.0;
  uStack_40._4_4_ = 0.0;
  traverse(this,(SP *)&_Stack_78,(affine3f *)local_68);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_78._M_refcount);
  std::
  vector<std::shared_ptr<pbrt::LightSource>,_std::allocator<std::shared_ptr<pbrt::LightSource>_>_>::
  operator=(&((this->result).super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             lightSources,
            &((world->super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
             lightSources);
  return;
}

Assistant:

SingleLevelFlattener(Object::SP world)
      : result(std::make_shared<Object>())
    {
      for (auto lightSource : world->lightSources)
        result->lightSources.push_back(lightSource);
      traverse(world, affine3f::identity());
      result->lightSources = world->lightSources;
    }